

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O3

int __thiscall Fl_Code_Type::handle_editor_changes(Fl_Code_Type *this)

{
  int iVar1;
  char *newcode;
  char *local_10;
  
  local_10 = (char *)0x0;
  iVar1 = ExternalCodeEditor::handle_changes(&this->editor_,&local_10,0);
  if (iVar1 != -1) {
    if (iVar1 == 1) {
      Fl_Type::name(&this->super_Fl_Type,local_10);
      free(local_10);
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int handle_editor_changes() {
    const char *newcode = 0;
    switch ( editor_.handle_changes(&newcode) ) {
      case 1: {            // (1)=changed
        name(newcode);     // update value in ram
        free((void*)newcode);
        return 1;
      }
      case -1: return -1;  // (-1)=error -- couldn't read file (dialog showed reason)
      default: break;      // (0)=no change
    }
    return 0;
  }